

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GroupFilterCase::iterate(GroupFilterCase *this)

{
  TestLog *log;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  MessageFilter *desc;
  value_type *__value;
  uchar *puVar6;
  size_t tbslen;
  allocator<char> local_199;
  string local_198;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  resMessages2;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  refMessages;
  ScopedLogSection section2;
  ScopedLogSection section1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter2base;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  resMessages1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter1base;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  resMessages0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter1full;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filter2full;
  MessageFilter baseFilter;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_48;
  long lVar5;
  
  bVar1 = isKHRDebugSupported((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase
                              .m_context);
  if (bVar1) {
    iVar2 = (*((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.m_context)->
              m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    log = ((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.super_TestCase.
           super_TestNode.m_testCtx)->m_log;
    (**(code **)(lVar5 + 0x5e0))(0x92e0);
    (**(code **)(lVar5 + 0x5e0))(0x8242);
    (**(code **)(lVar5 + 0x420))(BaseCase::callbackHandle,this);
    tbslen = 1;
    (**(code **)(lVar5 + 0x428))(0x1100,0x1100,0x1100,0,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&baseFilter,"Reference run",(allocator<char> *)&local_198);
    desc = &baseFilter;
    anon_unknown_1::FilterCase::genMessages
              (&refMessages,&this->super_FilterCase,true,(string *)desc);
    std::__cxx11::string::~string((string *)&baseFilter);
    dVar3 = deStringHash((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.
                         super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
    uVar4 = tcu::CommandLine::getBaseSeed
                      (((this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.
                        super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
    local_198._M_dataplus._M_p = (pointer)0x0;
    local_198._M_string_length = 0;
    local_198.field_2._M_allocated_capacity = 0;
    baseFilter.source = 0x1100;
    baseFilter.type = 0x1100;
    baseFilter.severity = 0x1100;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&baseFilter.ids,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
    baseFilter.enabled = true;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
              *)&local_198,(size_type)&baseFilter,__value,(allocator_type *)desc);
    uVar4 = uVar4 ^ dVar3;
    puVar6 = (uchar *)(ulong)uVar4;
    anon_unknown_1::FilterCase::genFilters
              (&filter0,&this->super_FilterCase,&refMessages,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                *)&local_198,uVar4,(int)tbslen);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *)&local_198);
    resMessages0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resMessages0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resMessages0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_1::FilterCase::applyFilters(&this->super_FilterCase,&filter0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"Filtered run, default debug group",
               (allocator<char> *)&filter1base);
    anon_unknown_1::FilterCase::genMessages(&resMessages2,&this->super_FilterCase,false,&local_198);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::operator=(&resMessages0,&resMessages2);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&resMessages2);
    std::__cxx11::string::~string((string *)&local_198);
    anon_unknown_1::FilterCase::verify
              (&this->super_FilterCase,(EVP_PKEY_CTX *)&refMessages,(uchar *)&resMessages0,
               (size_t)&filter0,puVar6,tbslen);
    puVar6 = (uchar *)(ulong)(uVar4 ^ 0xdeadbeef);
    local_198._M_dataplus._M_p = (pointer)0x0;
    local_198._M_string_length = 0;
    local_198.field_2._M_allocated_capacity = 0;
    anon_unknown_1::FilterCase::genFilters
              (&filter1base,&this->super_FilterCase,&refMessages,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                *)&local_198,uVar4 ^ 0xdeadbeef,(int)tbslen);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *)&local_198);
    join<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
              (&filter1full,&filter0,&filter1base);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&resMessages1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resMessages2,"Pushing Debug Group",(allocator<char> *)&filter2base);
    tcu::ScopedLogSection::ScopedLogSection(&section1,log,&local_198,(string *)&resMessages2);
    std::__cxx11::string::~string((string *)&resMessages2);
    std::__cxx11::string::~string((string *)&local_198);
    resMessages1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resMessages1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resMessages1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(lVar5 + 0x1200))(0x824a,1,0xffffffffffffffff,"Test Group");
    anon_unknown_1::FilterCase::applyFilters(&this->super_FilterCase,&filter1base);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"Filtered run, pushed one debug group",
               (allocator<char> *)&filter2base);
    anon_unknown_1::FilterCase::genMessages(&resMessages2,&this->super_FilterCase,false,&local_198);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::operator=(&resMessages1,&resMessages2);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&resMessages2);
    std::__cxx11::string::~string((string *)&local_198);
    anon_unknown_1::FilterCase::verify
              (&this->super_FilterCase,(EVP_PKEY_CTX *)&refMessages,(uchar *)&resMessages1,
               (size_t)&filter1full,puVar6,tbslen);
    local_198._M_dataplus._M_p = (pointer)0x0;
    local_198._M_string_length = 0;
    local_198.field_2._M_allocated_capacity = 0;
    puVar6 = (uchar *)(ulong)(uVar4 ^ 0x43211234);
    anon_unknown_1::FilterCase::genFilters
              (&filter2base,&this->super_FilterCase,&refMessages,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                *)&local_198,uVar4 ^ 0x43211234,(int)tbslen);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *)&local_198);
    join<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>
              (&filter2full,&filter1full,&filter2base);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resMessages2,"Pushing Debug Group",&local_199);
    tcu::ScopedLogSection::ScopedLogSection(&section2,log,&local_198,(string *)&resMessages2);
    std::__cxx11::string::~string((string *)&resMessages2);
    std::__cxx11::string::~string((string *)&local_198);
    resMessages2.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    resMessages2.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resMessages2.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(lVar5 + 0x1200))(0x824a,1,0xffffffffffffffff,"Nested Test Group");
    anon_unknown_1::FilterCase::applyFilters(&this->super_FilterCase,&filter2base);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"Filtered run, pushed two debug groups",&local_199);
    anon_unknown_1::FilterCase::genMessages(&local_48,&this->super_FilterCase,false,&local_198);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::operator=(&resMessages2,&local_48);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_48);
    std::__cxx11::string::~string((string *)&local_198);
    anon_unknown_1::FilterCase::verify
              (&this->super_FilterCase,(EVP_PKEY_CTX *)&refMessages,(uchar *)&resMessages2,
               (size_t)&filter2full,puVar6,tbslen);
    (**(code **)(lVar5 + 0x1030))();
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&resMessages2);
    tcu::ScopedLogSection::~ScopedLogSection(&section2);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&filter2full);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&filter2base);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"Filtered run, popped second debug group",
               (allocator<char> *)&filter2base);
    anon_unknown_1::FilterCase::genMessages(&resMessages2,&this->super_FilterCase,false,&local_198);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::operator=(&resMessages1,&resMessages2);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&resMessages2);
    std::__cxx11::string::~string((string *)&local_198);
    anon_unknown_1::FilterCase::verify
              (&this->super_FilterCase,(EVP_PKEY_CTX *)&refMessages,(uchar *)&resMessages1,
               (size_t)&filter1full,puVar6,tbslen);
    (**(code **)(lVar5 + 0x1030))();
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&resMessages1);
    tcu::ScopedLogSection::~ScopedLogSection(&section1);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&filter1full);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&filter1base);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"Filtered run, popped first debug group",
               (allocator<char> *)&filter1base);
    anon_unknown_1::FilterCase::genMessages(&resMessages2,&this->super_FilterCase,false,&local_198);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::operator=(&resMessages0,&resMessages2);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&resMessages2);
    std::__cxx11::string::~string((string *)&local_198);
    anon_unknown_1::FilterCase::verify
              (&this->super_FilterCase,(EVP_PKEY_CTX *)&refMessages,(uchar *)&resMessages0,
               (size_t)&filter0,puVar6,tbslen);
    bVar1 = BaseCase::isDebugContext((BaseCase *)this);
    if ((!bVar1) &&
       (refMessages.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        refMessages.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"Verification accuracy is lacking without a debug context",
                 (allocator<char> *)&resMessages2);
      tcu::ResultCollector::addResult
                (&(this->super_FilterCase).super_BaseCase.m_results,QP_TEST_RESULT_QUALITY_WARNING,
                 &local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&resMessages0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&filter0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&baseFilter.ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&refMessages);
    (**(code **)(lVar5 + 0x4e8))(0x92e0);
    (**(code **)(lVar5 + 0x420))(0,0);
    tcu::ResultCollector::setTestContextResult
              (&(this->super_FilterCase).super_BaseCase.m_results,
               (this->super_FilterCase).super_BaseCase.super_ErrorCase.super_TestCase.super_TestCase
               .super_TestNode.m_testCtx);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x4e9);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GroupFilterCase::IterateResult GroupFilterCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::TestLog&			log			= m_testCtx.getLog();

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageCallback(callbackHandle, this);

	try
	{
		gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, true);

		{

			// Generate reference (all errors)
			const vector<MessageData>	refMessages		= genMessages(true, "Reference run");
			const deUint32				baseSeed		= deStringHash(getName()) ^ m_testCtx.getCommandLine().getBaseSeed();
			const MessageFilter			baseFilter		 (GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), true);
			const vector<MessageFilter>	filter0			= genFilters(refMessages, vector<MessageFilter>(1, baseFilter), baseSeed, 4);
			vector<MessageData>			resMessages0;

			applyFilters(filter0);

			resMessages0 = genMessages(false, "Filtered run, default debug group");

			// Initial verification
			verify(refMessages, resMessages0, filter0);

			{
				// Generate reference (filters inherited from parent)
				const vector<MessageFilter> filter1base		= genFilters(refMessages, vector<MessageFilter>(), baseSeed ^ 0xDEADBEEF, 4);
				const vector<MessageFilter>	filter1full		= join(filter0, filter1base);
				tcu::ScopedLogSection		section1		(log, "", "Pushing Debug Group");
				vector<MessageData>			resMessages1;

				gl.pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1, -1, "Test Group");
				applyFilters(filter1base);

				// First nested verification
				resMessages1 = genMessages(false, "Filtered run, pushed one debug group");
				verify(refMessages, resMessages1, filter1full);

				{
					// Generate reference (filters iherited again)
					const vector<MessageFilter>	filter2base		= genFilters(refMessages, vector<MessageFilter>(), baseSeed ^ 0x43211234, 4);
					const vector<MessageFilter>	filter2full		= join(filter1full, filter2base);
					tcu::ScopedLogSection		section2		(log, "", "Pushing Debug Group");
					vector<MessageData>			resMessages2;

					gl.pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1, -1, "Nested Test Group");
					applyFilters(filter2base);

					// Second nested verification
					resMessages2 = genMessages(false, "Filtered run, pushed two debug groups");
					verify(refMessages, resMessages2, filter2full);

					gl.popDebugGroup();
				}

				// First restore verification
				resMessages1 = genMessages(false, "Filtered run, popped second debug group");
				verify(refMessages, resMessages1, filter1full);

				gl.popDebugGroup();
			}

			// restore verification
			resMessages0 = genMessages(false, "Filtered run, popped first debug group");
			verify(refMessages, resMessages0, filter0);

			if (!isDebugContext() && refMessages.empty())
				m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
		}
	}
	catch (...)
	{
		gl.disable(GL_DEBUG_OUTPUT);
		gl.debugMessageCallback(DE_NULL, DE_NULL);
		throw;
	}

	gl.disable(GL_DEBUG_OUTPUT);
	gl.debugMessageCallback(DE_NULL, DE_NULL);
	m_results.setTestContextResult(m_testCtx);
	return STOP;
}